

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveIncbin::Encode(CDirectiveIncbin *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ByteArray data;
  string local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->size;
  if (args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ByteArray::fromFile(&data,&this->fileName,this->start,(size_t)args);
    if ((long)(int)data.size_ == this->size) {
      FileManager::write(g_fileManager,(int)data.data_,(void *)data.size_,(size_t)args);
    }
    else {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_38,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x17e940,(char *)&local_38,args);
      std::__cxx11::string::~string((string *)&local_38);
    }
    ByteArray::~ByteArray(&data);
  }
  return;
}

Assistant:

void CDirectiveIncbin::Encode() const
{
	if (size != 0)
	{
		ByteArray data = ByteArray::fromFile(fileName,(long)start,size);
		if ((int) data.size() != size)
		{
			Logger::printError(Logger::Error, "Could not read file \"%s\"",fileName.u8string());
			return;
		}
		g_fileManager->write(data.data(),data.size());
	}
}